

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

void __thiscall
pstore::sparse_array<std::__cxx11::string,unsigned_long>::
sparse_array<unsigned_long_const*,std::__cxx11::string_const*>
          (sparse_array<std::__cxx11::string,unsigned_long> *this,unsigned_long *first_index,
          unsigned_long *last_index,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last_value)

{
  unsigned_long uVar1;
  sparse_array<std::__cxx11::string,unsigned_long> *psVar2;
  
  uVar1 = bitmap<unsigned_long_const*,void>(first_index,last_index);
  *(unsigned_long *)this = uVar1;
  *(sparse_array<std::__cxx11::string,unsigned_long> **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (sparse_array<std::__cxx11::string,unsigned_long>)0x0;
  if (first_index != last_index) {
    if (first_value != last_value) {
      std::__cxx11::string::_M_assign((string *)(this + 8));
      first_value = first_value + 1;
    }
    first_index = first_index + 1;
  }
  psVar2 = this + 0x38;
  for (; (first_index != last_index && (first_value != last_value)); first_value = first_value + 1)
  {
    std::__cxx11::string::string((string *)(psVar2 + -0x10),(string *)first_value);
    first_index = first_index + 1;
    psVar2 = psVar2 + 0x20;
  }
  for (; first_index != last_index; first_index = first_index + 1) {
    *(sparse_array<std::__cxx11::string,unsigned_long> **)(psVar2 + -0x10) = psVar2;
    *(undefined8 *)(psVar2 + -8) = 0;
    *psVar2 = (sparse_array<std::__cxx11::string,unsigned_long>)0x0;
    psVar2 = psVar2 + 0x20;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }